

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::BuildRun(MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
           *this,idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  value_type vVar4;
  bool bVar5;
  idx_t l;
  reference pvVar6;
  reference pvVar7;
  reference this_00;
  ulong uVar8;
  ulong uVar9;
  const_reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t j;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *__s;
  unsigned_long uVar16;
  RunElement *insert_val;
  long lVar17;
  size_type sVar18;
  long lVar19;
  unsigned_long *puVar20;
  size_type __n;
  RunElement local_8b8;
  RunElement local_898;
  size_type local_878;
  unsigned_long local_870;
  reference local_868;
  reference local_860;
  RunElement local_858;
  RunElement local_838;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> bounds;
  Games games;
  RunElements players;
  
  pvVar6 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::get<true>(&this->tree,level_idx);
  pvVar7 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::get<true>(&this->tree,level_idx);
  local_860 = pvVar7;
  this_00 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::get<true>(&this->tree,level_idx - 1);
  uVar8 = 1;
  uVar9 = 0x20;
  uVar15 = uVar8;
  for (; uVar13 = uVar9, uVar8 < level_idx; uVar8 = uVar8 + 1) {
    uVar9 = uVar13 << 5;
    uVar15 = uVar13;
  }
  uVar8 = (long)(pvVar6->first).
                super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                .
                super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar6->first).
                super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                .
                super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _0_4_ = 0xffffffff;
  local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _4_4_ = 0xffffffff;
  local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._0_4_ = 0xffffffff;
  local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = 0xffffffff;
  local_858.second = 0xffffffffffffffff;
  local_868 = pvVar6;
  switchD_014c3389::default(&bounds,0,0x200);
  __s = players._M_elems;
  switchD_014c3389::default(__s,0,0x300);
  local_878 = uVar13 * run_idx;
  puVar20 = &bounds._M_elems[0].second;
  sVar18 = local_878;
  for (uVar16 = 0; uVar16 != 0x20; uVar16 = uVar16 + 1) {
    uVar9 = uVar8;
    if (sVar18 < uVar8) {
      uVar9 = sVar18;
    }
    uVar1 = uVar15 + sVar18;
    uVar14 = uVar8;
    if (uVar1 < uVar8) {
      uVar14 = uVar1;
    }
    ((pair<unsigned_long,_unsigned_long> *)(puVar20 + -1))->first = uVar9;
    *puVar20 = uVar14;
    if (uVar9 == uVar14) {
      *(undefined4 *)
       &(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
        super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
        super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = 0xffffffff;
      *(undefined4 *)
       ((long)&(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->
               first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
               super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
               _M_head_impl + 4) = 0xffffffff;
      *(undefined4 *)
       &(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
        super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0xffffffff;
      *(undefined4 *)
       ((long)&(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->
               first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 4) = 0xffffffff;
      __s->second = 0xffffffffffffffff;
    }
    else {
      local_870 = uVar16;
      pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                          (&this_00->first,sVar18);
      uVar16 = (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
           super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar16;
      __s->second = local_870;
      uVar16 = local_870;
    }
    puVar20 = puVar20 + 2;
    __s = __s + 1;
    sVar18 = uVar1;
  }
  switchD_014c3389::default(&games,0,0x2e8);
  __n = run_idx * ((uVar13 >> 5) + 2) * 0x20;
  StartGames(&local_898,this,&games,&players,&local_858);
  sVar18 = local_878;
  while( true ) {
    bVar5 = ::std::operator!=(&local_898,&local_858);
    puVar2 = (local_860->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (local_860->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (!bVar5) break;
    if ((puVar2 != puVar3) && ((sVar18 & 0x1f) == 0)) {
      for (lVar17 = 0; lVar17 != 0x200; lVar17 = lVar17 + 0x10) {
        vVar4 = *(value_type *)((long)&bounds._M_elems[0].first + lVar17);
        pvVar11 = vector<unsigned_long,_true>::get<true>(&pvVar7->second,__n);
        *pvVar11 = vVar4;
        __n = __n + 1;
      }
    }
    pvVar12 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                        (&local_868->first,sVar18);
    (pvVar12->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)
         local_898.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    (pvVar12->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         local_898.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    uVar8 = bounds._M_elems[local_898.second].first + 1;
    bounds._M_elems[local_898.second].first = uVar8;
    if (uVar8 < bounds._M_elems[local_898.second].second) {
      pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                          (&this_00->first,uVar8);
      local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)
             (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl;
      local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      local_838.second = local_898.second;
      insert_val = &local_838;
    }
    else {
      insert_val = &local_858;
    }
    ReplayGames(&local_8b8,this,&games,local_898.second,insert_val);
    local_898.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    local_898.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_898.second = local_8b8.second;
    sVar18 = sVar18 + 1;
  }
  if (puVar2 != puVar3) {
    for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
      for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
        vVar4 = *(value_type *)((long)&bounds._M_elems[0].first + lVar19);
        pvVar11 = vector<unsigned_long,_true>::get<true>(&pvVar7->second,__n);
        *pvVar11 = vVar4;
        __n = __n + 1;
      }
    }
  }
  LOCK();
  (this->build_complete).super___atomic_base<unsigned_long>._M_i =
       (this->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}